

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

void __thiscall
S2Polygon::S2Polygon
          (S2Polygon *this,
          vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
          *loops,S2Debug override)

{
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  local_30;
  
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Polygon_002c2b58;
  (this->loops_).
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loops_).
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->loops_).
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->s2debug_override_ = override;
  (this->bound_).super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2Region_002c2078;
  (this->bound_).lat_.bounds_.c_[0] = 1.0;
  (this->bound_).lat_.bounds_.c_[1] = 0.0;
  (this->bound_).lng_.bounds_.c_[0] = 3.141592653589793;
  (this->bound_).lng_.bounds_.c_[1] = -3.141592653589793;
  (this->subregion_bound_).super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2Region_002c2078;
  (this->subregion_bound_).lat_.bounds_.c_[0] = 1.0;
  (this->subregion_bound_).lat_.bounds_.c_[1] = 0.0;
  (this->subregion_bound_).lng_.bounds_.c_[0] = 3.141592653589793;
  (this->subregion_bound_).lng_.bounds_.c_[1] = -3.141592653589793;
  MutableS2ShapeIndex::MutableS2ShapeIndex(&this->index_);
  local_30.
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (loops->
       super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_30.
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (loops->
       super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_30.
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (loops->
       super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (loops->
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (loops->
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (loops->
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  InitNested(this,&local_30);
  std::
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ::~vector(&local_30);
  return;
}

Assistant:

S2Polygon::S2Polygon(vector<unique_ptr<S2Loop>> loops, S2Debug override)
    : s2debug_override_(override) {
  InitNested(std::move(loops));
}